

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int __pid;
  int extraout_EAX;
  int iVar1;
  __pid_t _Var2;
  char *file;
  utsname uts;
  
  if (argc < 2) {
    fprintf(_stderr,"Usage: %s <child-hostname>\n",*argv);
    exit(1);
  }
  __pid = clone(childFunc,&_end,0x4000011,argv[1]);
  if (__pid == -1) {
    errExit("clone");
    __pid = extraout_EAX;
  }
  printf("PID of child created by clone() is %ld\n",(long)__pid);
  sleep(1);
  iVar1 = uname((utsname *)&uts);
  if (iVar1 == -1) {
    errExit("uname");
  }
  printf("uts.nodename in parent: %s\n");
  file = "uts namespace for parent: ";
  printf("uts namespace for parent: ");
  print_link(file);
  _Var2 = waitpid(__pid,(int *)0x0,0);
  if (_Var2 == -1) {
    errExit("waitpid");
  }
  puts("child has terminated");
  exit(0);
}

Assistant:

int
main(int argc, char *argv[])
{
    pid_t child_pid;
    struct utsname uts;

    if (argc < 2) {
        fprintf(stderr, "Usage: %s <child-hostname>\n", argv[0]);
        exit(EXIT_FAILURE);
    }

    /* Create a child that has its own UTS namespace;
       the child commences execution in childFunc() */

    child_pid = clone(childFunc,
                      child_stack + STACK_SIZE,   /* Points to start of
                                                     downwardly growing stack */
                      CLONE_NEWUTS | SIGCHLD, argv[1]);
    if (child_pid == -1)
        errExit("clone");
    printf("PID of child created by clone() is %ld\n", (long) child_pid);

    /* Parent falls through to here */

    sleep(1);           /* Give child time to change its hostname */

    /* Display the hostname in parent's UTS namespace. This will be
       different from the hostname in child's UTS namespace. */

    if (uname(&uts) == -1)
        errExit("uname");
    printf("uts.nodename in parent: %s\n", uts.nodename);
    printf("uts namespace for parent: ");
    print_link("/proc/self/ns/uts");

    if (waitpid(child_pid, NULL, 0) == -1)      /* Wait for child */
        errExit("waitpid");
    printf("child has terminated\n");

    exit(EXIT_SUCCESS);
}